

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSourceArrayLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::SourceArrayLoader::begin__param
          (SourceArrayLoader *this,param__AttributeData *attributeData)

{
  long *in_RSI;
  AccessorParameter *in_RDI;
  AccessorParameter accessorParameter;
  SourceBase *in_stack_ffffffffffffffa0;
  string local_50 [32];
  string local_30 [32];
  long *local_10;
  
  if (*(long *)&in_RDI[1].name != 0) {
    local_10 = in_RSI;
    SourceBase::AccessorParameter::AccessorParameter((AccessorParameter *)in_stack_ffffffffffffffa0)
    ;
    if ((*local_10 != 0) && (*(char *)*local_10 != '\0')) {
      std::__cxx11::string::operator=(local_50,(char *)*local_10);
    }
    std::__cxx11::string::operator=(local_30,(char *)local_10[3]);
    SourceBase::appendAccessorParameter(in_stack_ffffffffffffffa0,in_RDI);
    SourceBase::AccessorParameter::~AccessorParameter
              ((AccessorParameter *)in_stack_ffffffffffffffa0);
  }
  return true;
}

Assistant:

bool SourceArrayLoader::begin__param( const param__AttributeData& attributeData )
	{
		if ( mCurrentSoure )
		{
			SourceBase::AccessorParameter accessorParameter;
			if ( attributeData.name && *attributeData.name )
			{
				accessorParameter.name = attributeData.name;
			}

			// the type is required. We don't need to check
			accessorParameter.type = attributeData.type;
			mCurrentSoure->appendAccessorParameter( accessorParameter );
		}
		return true;
	}